

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_get.c
# Opt level: O2

int IOget_array_size_dimen(char *str,FMFieldList fields,int dimen,int *control_field)

{
  char *__nptr;
  char cVar1;
  int iVar2;
  FMdata_type FVar3;
  char *pcVar4;
  char *pcVar5;
  long lVar6;
  int iVar7;
  char **ppcVar8;
  char *end;
  char field_name [1024];
  
  *control_field = -1;
  pcVar4 = strchr(str,0x5b);
  pcVar5 = (char *)0x0;
  if (pcVar4 == (char *)0x0) {
LAB_0011f981:
    return (int)pcVar5;
  }
  iVar7 = dimen + 1;
  while( true ) {
    __nptr = pcVar4 + 1;
    iVar7 = iVar7 + -1;
    if (iVar7 == 0) break;
    pcVar4 = strchr(__nptr,0x5b);
    if (pcVar4 == (char *)0x0) goto LAB_0011f981;
  }
  pcVar5 = (char *)strtol(__nptr,&end,0);
  if (__nptr != end) {
    if ((int)*end != 0x5d) {
      fprintf(_stderr,"Malformed array dimension, unexpected character \'%c\' in type spec \"%s\"\n"
              ,(ulong)(uint)(int)*end,str);
      goto LAB_0011f950;
    }
    if ((long)pcVar5 < 1) {
      pcVar4 = "Non-positive array dimension %ld in type spec \"%s\"\n";
      goto LAB_0011f944;
    }
    goto LAB_0011f981;
  }
  for (lVar6 = 0; (cVar1 = pcVar4[lVar6 + 1], cVar1 != '\0' && (cVar1 != ']')); lVar6 = lVar6 + 1) {
    field_name[lVar6] = cVar1;
  }
  field_name[lVar6] = '\0';
  ppcVar8 = &fields->field_type;
  iVar7 = 0;
  do {
    if (((_FMField *)(ppcVar8 + -1))->field_name == (char *)0x0) {
      pcVar4 = "Array dimension \"%s\" in type spec\"%s\" not recognized.\n";
      pcVar5 = field_name;
LAB_0011f944:
      fprintf(_stderr,pcVar4,pcVar5,str);
LAB_0011f950:
      fwrite("Dimension must be a field name (for dynamic arrays) or a positive integer.\n",0x4b,1,
             _stderr);
      fwrite("To use a #define\'d value for the dimension, use the IOArrayDecl() macro.\n",0x49,1,
             _stderr);
LAB_0011f97d:
      pcVar5 = (char *)0xffffffffffffffff;
      goto LAB_0011f981;
    }
    iVar2 = strcmp(field_name,((_FMField *)(ppcVar8 + -1))->field_name);
    if (iVar2 == 0) {
      FVar3 = FMstr_to_data_type(*ppcVar8);
      if (FVar3 != integer_type) {
        pcVar5 = (char *)0x0;
        fprintf(_stderr,"Variable length control field \"%s\" not of integer type.\n",field_name);
        goto LAB_0011f981;
      }
      *control_field = iVar7;
      goto LAB_0011f97d;
    }
    iVar7 = iVar7 + 1;
    ppcVar8 = ppcVar8 + 3;
  } while( true );
}

Assistant:

extern int
IOget_array_size_dimen(const char *str, FMFieldList fields, int dimen, int *control_field)
{
    char *left_paren, *end;
    long static_size;

    *control_field = -1;
    if ((left_paren = strchr(str, '[')) == NULL) {
	return 0;
    }	
    while (dimen != 0) {
	left_paren = strchr(left_paren + 1, '[');
	if (left_paren == NULL) return 0;
	dimen--;
    }
    static_size = strtol(left_paren + 1, &end, 0);
    if (left_paren + 1 == end) {
	/* dynamic element */
	char field_name[1024];
	int count = 0;
	int i = 0;
	while (((left_paren+1)[count] != ']') &&
	       ((left_paren+1)[count] != 0)) {
	    field_name[count] = (left_paren+1)[count];
	    count++;
	}
	field_name[count] = 0;
	while (fields[i].field_name != NULL) {
	    if (strcmp(field_name, fields[i].field_name) == 0) {
		if (FMstr_to_data_type(fields[i].field_type) ==
		    integer_type) {
		    *control_field = i;
		    return -1;
		} else {
		    fprintf(stderr, "Variable length control field \"%s\" not of integer type.\n", field_name);
		    return 0;
		}
	    }
	    i++;
	}
	fprintf(stderr, "Array dimension \"%s\" in type spec\"%s\" not recognized.\n",
		field_name, str);
	fprintf(stderr, "Dimension must be a field name (for dynamic arrays) or a positive integer.\n");
	fprintf(stderr, "To use a #define'd value for the dimension, use the IOArrayDecl() macro.\n");
	return -1;
    }
    if (*end != ']') {
	fprintf(stderr, "Malformed array dimension, unexpected character '%c' in type spec \"%s\"\n",
		*end, str);
	fprintf(stderr, "Dimension must be a field name (for dynamic arrays) or a positive integer.\n");
	fprintf(stderr, "To use a #define'd value for the dimension, use the IOArrayDecl() macro.\n");
	return -1;
    }
    if (static_size <= 0) {
	fprintf(stderr, "Non-positive array dimension %ld in type spec \"%s\"\n",
		static_size, str);
	fprintf(stderr, "Dimension must be a field name (for dynamic arrays) or a positive integer.\n");
	fprintf(stderr, "To use a #define'd value for the dimension, use the IOArrayDecl() macro.\n");
	return -1;
    }
    return static_size;
}